

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_striped_avx2_256_64.c
# Opt level: O0

parasail_result_t *
parasail_nw_stats_table_striped_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  __m256i alVar7;
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  __m256i alVar11;
  __m256i alVar12;
  __m256i vH_00;
  __m256i vH_01;
  __m256i vH_02;
  __m256i vH_03;
  __m256i vH_04;
  __m256i vH_05;
  __m256i vH_06;
  __m256i vH_07;
  undefined1 auVar13 [32];
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i alVar14;
  __m256i b_07;
  __m256i b_08;
  __m256i b_09;
  __m256i b_10;
  __m256i b_11;
  __m256i b_12;
  undefined1 auVar15 [32];
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i a_09;
  __m256i a_10;
  __m256i a_11;
  __m256i a_12;
  __m256i a_13;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [24];
  undefined1 auVar38 [24];
  undefined1 auVar39 [24];
  __m256i *palVar40;
  __m256i *palVar41;
  __m256i *palVar42;
  __m256i *palVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  long lVar47;
  longlong lVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  long lVar55;
  longlong lVar56;
  long lVar57;
  longlong lVar58;
  long lVar59;
  longlong lVar60;
  longlong lVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  __m256i vHL_1;
  __m256i vHS_1;
  __m256i vHM_1;
  __m256i vH_1;
  __m256i cond;
  __m256i case2_1;
  __m256i case1_1;
  int64_t tmp2;
  int64_t tmp_6;
  __m256i vHp;
  __m256i case2;
  __m256i case1;
  __m256i *tmp_5;
  __m256i *tmp_4;
  __m256i *tmp_3;
  __m256i *tmp_2;
  __m256i *vPS;
  __m256i *vPM;
  __m256i *vP;
  __m256i vHL;
  __m256i vHS;
  __m256i vHM;
  __m256i vH_dag;
  __m256i vH;
  __m256i vFL;
  __m256i vFS;
  __m256i vFM;
  __m256i vF_ext;
  __m256i vF;
  __m256i vEL;
  __m256i vES;
  __m256i vEM;
  __m256i vE_ext;
  __m256i vE;
  __m256i vEF_opn;
  int64_t tmp_1;
  int64_t tmp;
  __m256i_64_t e;
  __m256i_64_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int64_t length;
  int64_t similar;
  int64_t matches;
  int64_t score;
  __m256i vOne;
  __m256i vZero;
  int64_t POS_LIMIT;
  int64_t NEG_LIMIT;
  __m256i vGapE;
  __m256i vGapO;
  int64_t *boundary;
  __m256i *pvEL;
  __m256i *pvES;
  __m256i *pvEM;
  __m256i *pvE;
  __m256i *pvHLLoad;
  __m256i *pvHLStore;
  __m256i *pvHSLoad;
  __m256i *pvHSStore;
  __m256i *pvHMLoad;
  __m256i *pvHMStore;
  __m256i *pvHLoad;
  __m256i *pvHStore;
  __m256i *vProfileS;
  __m256i *vProfileM;
  __m256i *vProfile;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t end_ref;
  int32_t end_query;
  int32_t s1Len;
  int32_t k;
  int32_t j;
  int32_t i;
  int32_t in_stack_ffffffffffffe508;
  int32_t in_stack_ffffffffffffe50c;
  int32_t in_stack_ffffffffffffe510;
  int32_t in_stack_ffffffffffffe514;
  long in_stack_ffffffffffffe518;
  long in_stack_ffffffffffffe520;
  long in_stack_ffffffffffffe528;
  longlong in_stack_ffffffffffffe530;
  int *in_stack_ffffffffffffe540;
  longlong lVar73;
  longlong lStack_1ab8;
  __m256i *in_stack_ffffffffffffe550;
  undefined8 in_stack_ffffffffffffe558;
  undefined8 in_stack_ffffffffffffe560;
  longlong lVar74;
  undefined8 in_stack_ffffffffffffe568;
  longlong lVar75;
  longlong in_stack_ffffffffffffe570;
  longlong lVar76;
  undefined8 in_stack_ffffffffffffe578;
  undefined8 in_stack_ffffffffffffe580;
  undefined8 in_stack_ffffffffffffe588;
  longlong lVar77;
  longlong in_stack_ffffffffffffe590;
  longlong lVar78;
  longlong lStack_1a68;
  __m256i local_1a60;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined1 local_19c0 [16];
  longlong lStack_19b0;
  longlong lStack_19a8;
  undefined1 local_1980 [16];
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  __m256i local_1920;
  __m256i local_1900;
  __m256i local_18e0;
  long local_18c0;
  long lStack_18b8;
  long lStack_18b0;
  long lStack_18a8;
  __m256i local_18a0;
  undefined1 local_1880 [32];
  undefined1 local_1860 [32];
  undefined1 local_1840 [32];
  long local_1820;
  long lStack_1818;
  long lStack_1810;
  long lStack_1808;
  undefined1 local_1800 [16];
  longlong lStack_17f0;
  longlong lStack_17e8;
  longlong local_17e0;
  longlong lStack_17d8;
  longlong lStack_17d0;
  longlong lStack_17c8;
  longlong local_17c0;
  longlong lStack_17b8;
  longlong lStack_17b0;
  longlong lStack_17a8;
  longlong local_17a0;
  longlong lStack_1798;
  longlong lStack_1790;
  longlong lStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  longlong local_1740;
  longlong lStack_1738;
  longlong lStack_1730;
  longlong lStack_1728;
  longlong local_1700 [4];
  longlong local_16e0 [6];
  int local_16b0;
  int local_16ac;
  parasail_result_t *local_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined1 local_1680 [16];
  undefined1 auStack_1670 [16];
  undefined1 local_1660 [16];
  undefined1 auStack_1650 [16];
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  longlong local_1620;
  longlong local_1618;
  longlong local_1610;
  ulong local_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  ulong local_15b0;
  ulong local_15a8;
  undefined1 local_15a0 [16];
  undefined1 auStack_1590 [16];
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  int64_t *local_1560;
  __m256i *local_1558;
  __m256i *local_1550;
  __m256i *local_1548;
  __m256i *local_1540;
  __m256i *local_1538;
  __m256i *local_1530;
  __m256i *local_1528;
  __m256i *local_1520;
  __m256i *local_1518;
  __m256i *local_1510;
  __m256i *local_1508;
  __m256i *local_1500;
  long local_14f8;
  long local_14f0;
  long local_14e8;
  int local_14e0;
  int local_14dc;
  int local_14d8;
  int local_14d4;
  long local_14d0;
  int local_14c4;
  int local_14c0;
  int local_14bc;
  int local_14b8;
  int local_14b4;
  int local_14b0;
  int local_14ac;
  int local_14a8;
  int local_14a4;
  long local_14a0;
  parasail_result_t *local_1490;
  ulong local_1488;
  ulong local_1480;
  undefined8 local_1478;
  ulong local_1470;
  ulong local_1468;
  undefined1 local_1460 [32];
  longlong local_1440;
  longlong lStack_1438;
  longlong lStack_1430;
  longlong lStack_1428;
  __m256i *local_1408;
  longlong local_1400;
  longlong lStack_13f8;
  longlong lStack_13f0;
  longlong lStack_13e8;
  __m256i *local_13c8;
  longlong local_13c0;
  longlong lStack_13b8;
  longlong lStack_13b0;
  longlong lStack_13a8;
  __m256i *local_1388;
  long local_1380;
  long lStack_1378;
  long lStack_1370;
  long lStack_1368;
  __m256i *local_1348;
  longlong local_1340;
  longlong lStack_1338;
  longlong lStack_1330;
  longlong lStack_1328;
  __m256i *local_1308;
  longlong local_1300;
  longlong lStack_12f8;
  longlong lStack_12f0;
  longlong lStack_12e8;
  __m256i *local_12c8;
  longlong local_12c0;
  longlong lStack_12b8;
  longlong lStack_12b0;
  longlong lStack_12a8;
  __m256i *local_1288;
  longlong local_1280;
  longlong lStack_1278;
  longlong lStack_1270;
  longlong lStack_1268;
  __m256i *local_1248;
  longlong local_1240;
  longlong lStack_1238;
  longlong lStack_1230;
  longlong lStack_1228;
  __m256i *local_1208;
  longlong local_1200;
  longlong lStack_11f8;
  longlong lStack_11f0;
  longlong lStack_11e8;
  __m256i *local_11c8;
  longlong local_11c0;
  longlong lStack_11b8;
  longlong lStack_11b0;
  longlong lStack_11a8;
  __m256i *local_1188;
  long local_1180;
  long lStack_1178;
  long lStack_1170;
  long lStack_1168;
  __m256i *local_1148;
  __m256i *local_1108;
  __m256i *local_10d8;
  __m256i *local_10d0;
  __m256i *local_10c8;
  __m256i *local_10c0;
  __m256i *local_10b8;
  __m256i *local_10b0;
  __m256i *local_10a8;
  __m256i *local_10a0;
  __m256i *local_1098;
  __m256i *local_1090;
  undefined1 (*local_1088) [32];
  __m256i *local_1080;
  __m256i *local_1078;
  __m256i *local_1070;
  __m256i *local_1068;
  __m256i *local_1060;
  undefined1 (*local_1058) [32];
  undefined1 (*local_1050) [32];
  undefined1 (*local_1048) [32];
  __m256i *local_1040;
  __m256i *local_1038;
  __m256i *local_1030;
  __m256i *local_1028;
  __m256i *local_1020;
  __m256i *local_1018;
  __m256i *local_1010;
  __m256i *local_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  longlong local_fe0;
  longlong lStack_fd8;
  longlong lStack_fd0;
  longlong lStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  longlong local_f60;
  longlong lStack_f58;
  longlong lStack_f50;
  longlong lStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  longlong local_f20;
  longlong lStack_f18;
  longlong lStack_f10;
  longlong lStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  longlong local_ea0;
  longlong lStack_e98;
  longlong lStack_e90;
  longlong lStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  longlong lStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  longlong local_e20;
  longlong lStack_e18;
  longlong lStack_e10;
  longlong lStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  longlong local_de0;
  longlong lStack_dd8;
  longlong lStack_dd0;
  longlong lStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  longlong local_da0;
  longlong lStack_d98;
  longlong lStack_d90;
  longlong lStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  longlong local_d60;
  longlong lStack_d58;
  longlong lStack_d50;
  longlong lStack_d48;
  long local_d40;
  long lStack_d38;
  long lStack_d30;
  long lStack_d28;
  long local_d20;
  long lStack_d18;
  long lStack_d10;
  long lStack_d08;
  long local_d00;
  long lStack_cf8;
  long lStack_cf0;
  long lStack_ce8;
  long local_ce0;
  long lStack_cd8;
  long lStack_cd0;
  long lStack_cc8;
  long local_cc0;
  long lStack_cb8;
  long lStack_cb0;
  long lStack_ca8;
  long local_ca0;
  long lStack_c98;
  long lStack_c90;
  long lStack_c88;
  long local_c80;
  long lStack_c78;
  long lStack_c70;
  long lStack_c68;
  long local_c60;
  long lStack_c58;
  long lStack_c50;
  long lStack_c48;
  long local_c40;
  long lStack_c38;
  long lStack_c30;
  long lStack_c28;
  long local_c20;
  long lStack_c18;
  long lStack_c10;
  long lStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  longlong local_b80;
  longlong lStack_b78;
  longlong lStack_b70;
  longlong lStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  longlong local_b20;
  longlong lStack_b18;
  longlong lStack_b10;
  longlong lStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  longlong lStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  longlong lStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  longlong lStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  longlong local_940;
  longlong lStack_938;
  longlong lStack_930;
  longlong lStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  longlong local_8e0;
  longlong lStack_8d8;
  longlong lStack_8d0;
  longlong lStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  longlong local_820;
  longlong lStack_818;
  longlong lStack_810;
  longlong lStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  longlong lStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  longlong local_7c0;
  longlong lStack_7b8;
  longlong lStack_7b0;
  longlong lStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  longlong lStack_788;
  long local_780;
  long lStack_778;
  long lStack_770;
  long lStack_768;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  long local_720;
  long lStack_718;
  long lStack_710;
  long lStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  longlong lStack_6c8;
  long local_6c0;
  long lStack_6b8;
  long lStack_6b0;
  long lStack_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  long local_660;
  long lStack_658;
  long lStack_650;
  long lStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  longlong lStack_608;
  long local_600;
  long lStack_5f8;
  long lStack_5f0;
  long lStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  long local_5a0;
  long lStack_598;
  long lStack_590;
  long lStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  longlong lStack_548;
  undefined1 local_540 [16];
  undefined1 auStack_530 [16];
  long local_520;
  long lStack_518;
  long lStack_510;
  long lStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  long local_4e0;
  long lStack_4d8;
  long lStack_4d0;
  long lStack_4c8;
  undefined1 local_4c0 [16];
  undefined1 auStack_4b0 [16];
  long local_4a0;
  long lStack_498;
  long lStack_490;
  long lStack_488;
  undefined1 local_480 [16];
  undefined1 auStack_470 [16];
  longlong local_460;
  longlong lStack_458;
  longlong lStack_450;
  longlong lStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  long local_420;
  long lStack_418;
  long lStack_410;
  long lStack_408;
  undefined1 local_400 [16];
  undefined1 auStack_3f0 [16];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [16];
  undefined1 auStack_3b0 [16];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  long local_380;
  long lStack_378;
  long lStack_370;
  long lStack_368;
  long local_360;
  long lStack_358;
  long lStack_350;
  long lStack_348;
  long local_340;
  long lStack_338;
  long lStack_330;
  long lStack_328;
  long local_320;
  long lStack_318;
  long lStack_310;
  long lStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  longlong local_2e0;
  longlong lStack_2d8;
  longlong lStack_2d0;
  longlong lStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  longlong local_2a0;
  longlong lStack_298;
  longlong lStack_290;
  longlong lStack_288;
  long local_280;
  long lStack_278;
  long lStack_270;
  long lStack_268;
  long local_260;
  long lStack_258;
  long lStack_250;
  long lStack_248;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  long local_1c0;
  long lStack_1b8;
  long lStack_1b0;
  long lStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  undefined1 local_140 [32];
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  undefined1 local_80 [32];
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_14b0 = 0;
  local_14b4 = 0;
  local_14b8 = 0;
  local_14bc = 0;
  local_14c0 = 0;
  local_14c4 = 0;
  local_14d0 = 0;
  local_14d4 = 0;
  local_14d8 = 0;
  local_14dc = 0;
  local_14e0 = 0;
  local_14e8 = 0;
  local_14f0 = 0;
  local_14f8 = 0;
  local_1500 = (__m256i *)0x0;
  local_1508 = (__m256i *)0x0;
  local_1510 = (__m256i *)0x0;
  local_1518 = (__m256i *)0x0;
  local_1520 = (__m256i *)0x0;
  local_1528 = (__m256i *)0x0;
  local_1530 = (__m256i *)0x0;
  local_1538 = (__m256i *)0x0;
  local_1540 = (__m256i *)0x0;
  local_1548 = (__m256i *)0x0;
  local_1550 = (__m256i *)0x0;
  local_1558 = (__m256i *)0x0;
  local_1560 = (int64_t *)0x0;
  local_15a8 = 0;
  local_15b0 = 0;
  local_1608 = 0;
  local_1610 = 0;
  local_1618 = 0;
  local_1620 = 0;
  local_16a8 = (parasail_result_t *)0x0;
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_striped_profile_avx2_256_64",
            "profile");
    local_1490 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x60) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_striped_profile_avx2_256_64",
            "profile->profile64.score");
    local_1490 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_striped_profile_avx2_256_64",
            "profile->matrix");
    local_1490 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_table_striped_profile_avx2_256_64",
            "profile->s1Len");
    local_1490 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_nw_stats_table_striped_profile_avx2_256_64","s2");
    local_1490 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_nw_stats_table_striped_profile_avx2_256_64",
            "s2Len");
    local_1490 = (parasail_result_t *)0x0;
  }
  else if (in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_table_striped_profile_avx2_256_64",
            "open");
    local_1490 = (parasail_result_t *)0x0;
  }
  else if (in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_nw_stats_table_striped_profile_avx2_256_64",
            "gap");
    local_1490 = (parasail_result_t *)0x0;
  }
  else {
    local_14b0 = 0;
    local_14b4 = 0;
    local_14b8 = 0;
    local_14bc = *(int *)(in_RDI + 8);
    local_14c0 = local_14bc + -1;
    local_14c4 = in_EDX + -1;
    local_14d0 = *(long *)(in_RDI + 0x10);
    local_14d4 = 4;
    local_14d8 = (local_14bc + 3) / 4;
    local_14dc = (local_14bc + -1) % local_14d8;
    local_14e0 = ~((local_14bc + -1) / local_14d8) + 4;
    local_14e8 = *(long *)(in_RDI + 0x60);
    local_14f0 = *(long *)(in_RDI + 0x68);
    local_14f8 = *(long *)(in_RDI + 0x70);
    local_1468 = (ulong)in_ECX;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = local_1468;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = local_1468;
    local_180 = vpunpcklqdq_avx(auVar49,auVar62);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = local_1468;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = local_1468;
    auStack_170 = vpunpcklqdq_avx(auVar63,auVar69);
    local_1580 = local_180._0_8_;
    uStack_1578 = local_180._8_8_;
    uStack_1570 = auStack_170._0_8_;
    uStack_1568 = auStack_170._8_8_;
    local_1470 = (ulong)in_R8D;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = local_1470;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = local_1470;
    auVar49 = vpunpcklqdq_avx(auVar50,auVar64);
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_1470;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = local_1470;
    auVar50 = vpunpcklqdq_avx(auVar51,auVar70);
    local_140._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar50;
    local_140._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar49;
    if (-in_ECX < *(int *)(local_14d0 + 0x20)) {
      lVar44 = (long)in_ECX;
    }
    else {
      lVar44 = -(long)*(int *)(local_14d0 + 0x20);
    }
    local_1608 = lVar44 + 0x8000000000000001;
    local_15b0 = 0x7ffffffffffffffe - (long)*(int *)(local_14d0 + 0x1c);
    local_1460._8_8_ = SUB328(ZEXT832(0),4);
    local_15e0 = 0;
    uStack_15d8 = local_1460._8_8_;
    uStack_15d0 = 0;
    uStack_15c8 = 0;
    local_1478 = 1;
    local_c8 = 1;
    local_d0 = 1;
    local_d8 = 1;
    local_e0 = 1;
    local_100 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(1));
    auStack_f0 = vpunpcklqdq_avx(ZEXT816(1),ZEXT816(1));
    local_1600 = local_100._0_8_;
    uStack_15f8 = local_100._8_8_;
    uStack_15f0 = auStack_f0._0_8_;
    uStack_15e8 = auStack_f0._8_8_;
    local_1610 = 0;
    local_1618 = 0;
    local_1620 = 0;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = local_1608;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = local_1608;
    local_c0 = vpunpcklqdq_avx(auVar52,auVar65);
    auVar66._8_8_ = 0;
    auVar66._0_8_ = local_1608;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = local_1608;
    auStack_b0 = vpunpcklqdq_avx(auVar66,auVar71);
    local_1640 = local_c0._0_8_;
    uStack_1638 = local_c0._8_8_;
    uStack_1630 = auStack_b0._0_8_;
    uStack_1628 = auStack_b0._8_8_;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = local_15b0;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = local_15b0;
    auVar49 = vpunpcklqdq_avx(auVar53,auVar67);
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_15b0;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = local_15b0;
    auVar50 = vpunpcklqdq_avx(auVar54,auVar72);
    local_80._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar50;
    local_80._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar49;
    local_16a0 = local_c0._0_8_;
    uStack_1698 = local_c0._8_8_;
    uStack_1690 = auStack_b0._0_8_;
    uStack_1688 = auStack_b0._8_8_;
    local_15a8 = local_1608;
    local_14ac = in_R8D;
    local_14a8 = in_ECX;
    local_14a4 = in_EDX;
    local_14a0 = in_RSI;
    local_1488 = local_15b0;
    local_1480 = local_1608;
    local_1460 = ZEXT832(0) << 0x20;
    local_160 = local_1468;
    local_158 = local_1468;
    local_150 = local_1468;
    local_148 = local_1468;
    local_120 = local_1470;
    local_118 = local_1470;
    local_110 = local_1470;
    local_108 = local_1470;
    local_a0 = local_1608;
    local_98 = local_1608;
    local_90 = local_1608;
    local_88 = local_1608;
    local_50 = local_15b0;
    local_48 = local_15b0;
    local_40 = local_15b0;
    local_38 = local_15b0;
    local_15a0 = local_140._0_16_;
    auStack_1590 = local_140._16_16_;
    local_1660 = local_80._0_16_;
    auStack_1650 = local_80._16_16_;
    local_1680 = local_80._0_16_;
    auStack_1670 = local_80._16_16_;
    local_16a8 = parasail_result_new_table3(local_14d8 * 4,in_EDX);
    if (local_16a8 == (parasail_result_t *)0x0) {
      local_1490 = (parasail_result_t *)0x0;
    }
    else {
      local_16a8->flag = local_16a8->flag | 0x4810801;
      local_16a8->flag = local_16a8->flag | 0x20000;
      local_1500 = parasail_memalign___m256i(0x20,(long)local_14d8);
      local_1508 = parasail_memalign___m256i(0x20,(long)local_14d8);
      local_1510 = parasail_memalign___m256i(0x20,(long)local_14d8);
      local_1518 = parasail_memalign___m256i(0x20,(long)local_14d8);
      local_1520 = parasail_memalign___m256i(0x20,(long)local_14d8);
      local_1528 = parasail_memalign___m256i(0x20,(long)local_14d8);
      local_1530 = parasail_memalign___m256i(0x20,(long)local_14d8);
      local_1538 = parasail_memalign___m256i(0x20,(long)local_14d8);
      local_1540 = parasail_memalign___m256i(0x20,(long)local_14d8);
      local_1548 = parasail_memalign___m256i(0x20,(long)local_14d8);
      local_1550 = parasail_memalign___m256i(0x20,(long)local_14d8);
      local_1558 = parasail_memalign___m256i(0x20,(long)local_14d8);
      local_1560 = parasail_memalign_int64_t(0x20,(long)(local_14a4 + 1));
      if (local_1500 == (__m256i *)0x0) {
        local_1490 = (parasail_result_t *)0x0;
      }
      else if (local_1508 == (__m256i *)0x0) {
        local_1490 = (parasail_result_t *)0x0;
      }
      else if (local_1510 == (__m256i *)0x0) {
        local_1490 = (parasail_result_t *)0x0;
      }
      else if (local_1518 == (__m256i *)0x0) {
        local_1490 = (parasail_result_t *)0x0;
      }
      else if (local_1520 == (__m256i *)0x0) {
        local_1490 = (parasail_result_t *)0x0;
      }
      else if (local_1528 == (__m256i *)0x0) {
        local_1490 = (parasail_result_t *)0x0;
      }
      else if (local_1530 == (__m256i *)0x0) {
        local_1490 = (parasail_result_t *)0x0;
      }
      else if (local_1538 == (__m256i *)0x0) {
        local_1490 = (parasail_result_t *)0x0;
      }
      else if (local_1540 == (__m256i *)0x0) {
        local_1490 = (parasail_result_t *)0x0;
      }
      else if (local_1548 == (__m256i *)0x0) {
        local_1490 = (parasail_result_t *)0x0;
      }
      else if (local_1550 == (__m256i *)0x0) {
        local_1490 = (parasail_result_t *)0x0;
      }
      else if (local_1558 == (__m256i *)0x0) {
        local_1490 = (parasail_result_t *)0x0;
      }
      else if (local_1560 == (int64_t *)0x0) {
        local_1490 = (parasail_result_t *)0x0;
      }
      else {
        alVar7[1] = in_stack_ffffffffffffe520;
        alVar7[0] = in_stack_ffffffffffffe518;
        alVar7[2] = in_stack_ffffffffffffe528;
        alVar7[3] = in_stack_ffffffffffffe530;
        parasail_memset___m256i
                  (in_stack_ffffffffffffe550,alVar7,
                   CONCAT44(in_stack_ffffffffffffe514,in_stack_ffffffffffffe510));
        alVar8[1] = in_stack_ffffffffffffe520;
        alVar8[0] = in_stack_ffffffffffffe518;
        alVar8[2] = in_stack_ffffffffffffe528;
        alVar8[3] = in_stack_ffffffffffffe530;
        parasail_memset___m256i
                  (in_stack_ffffffffffffe550,alVar8,
                   CONCAT44(in_stack_ffffffffffffe514,in_stack_ffffffffffffe510));
        alVar9[1] = in_stack_ffffffffffffe520;
        alVar9[0] = in_stack_ffffffffffffe518;
        alVar9[2] = in_stack_ffffffffffffe528;
        alVar9[3] = in_stack_ffffffffffffe530;
        parasail_memset___m256i
                  (in_stack_ffffffffffffe550,alVar9,
                   CONCAT44(in_stack_ffffffffffffe514,in_stack_ffffffffffffe510));
        alVar10[1] = in_stack_ffffffffffffe520;
        alVar10[0] = in_stack_ffffffffffffe518;
        alVar10[2] = in_stack_ffffffffffffe528;
        alVar10[3] = in_stack_ffffffffffffe530;
        parasail_memset___m256i
                  (in_stack_ffffffffffffe550,alVar10,
                   CONCAT44(in_stack_ffffffffffffe514,in_stack_ffffffffffffe510));
        alVar11[1] = in_stack_ffffffffffffe520;
        alVar11[0] = in_stack_ffffffffffffe518;
        alVar11[2] = in_stack_ffffffffffffe528;
        alVar11[3] = in_stack_ffffffffffffe530;
        parasail_memset___m256i
                  (in_stack_ffffffffffffe550,alVar11,
                   CONCAT44(in_stack_ffffffffffffe514,in_stack_ffffffffffffe510));
        alVar12[1] = in_stack_ffffffffffffe520;
        alVar12[0] = in_stack_ffffffffffffe518;
        alVar12[2] = in_stack_ffffffffffffe528;
        alVar12[3] = in_stack_ffffffffffffe530;
        parasail_memset___m256i
                  (in_stack_ffffffffffffe550,alVar12,
                   CONCAT44(in_stack_ffffffffffffe514,in_stack_ffffffffffffe510));
        local_16ac = 0;
        for (local_14b0 = 0; local_14b0 < local_14d8; local_14b0 = local_14b0 + 1) {
          for (local_16b0 = 0; local_16b0 < local_14d4; local_16b0 = local_16b0 + 1) {
            in_stack_ffffffffffffe528 =
                 (long)(-(local_14ac * (local_16b0 * local_14d8 + local_14b0)) - local_14a8);
            in_stack_ffffffffffffe530 = in_stack_ffffffffffffe528;
            if (in_stack_ffffffffffffe528 < -0x8000000000000000) {
              in_stack_ffffffffffffe530 = -0x8000000000000000;
            }
            local_16e0[local_16b0] = in_stack_ffffffffffffe530;
            in_stack_ffffffffffffe528 = in_stack_ffffffffffffe528 - local_14a8;
            if (in_stack_ffffffffffffe528 < -0x8000000000000000) {
              in_stack_ffffffffffffe528 = -0x8000000000000000;
            }
            local_1700[local_16b0] = in_stack_ffffffffffffe528;
          }
          local_10d8 = local_1500 + local_16ac;
          (*local_10d8)[0] = local_16e0[0];
          (*local_10d8)[1] = local_16e0[1];
          (*local_10d8)[2] = local_16e0[2];
          (*local_10d8)[3] = local_16e0[3];
          local_1108 = local_1540 + local_16ac;
          (*local_1108)[0] = local_1700[0];
          (*local_1108)[1] = local_1700[1];
          (*local_1108)[2] = local_1700[2];
          (*local_1108)[3] = local_1700[3];
          local_16ac = local_16ac + 1;
        }
        *local_1560 = 0;
        for (local_14b0 = 1; local_14b0 <= local_14a4; local_14b0 = local_14b0 + 1) {
          in_stack_ffffffffffffe520 = (long)(-(local_14ac * (local_14b0 + -1)) - local_14a8);
          if (in_stack_ffffffffffffe520 < -0x8000000000000000) {
            in_stack_ffffffffffffe520 = -0x8000000000000000;
          }
          local_1560[local_14b0] = in_stack_ffffffffffffe520;
        }
        local_14b4 = 0;
        while( true ) {
          palVar43 = local_1508;
          palVar42 = local_1518;
          palVar41 = local_1528;
          palVar40 = local_1538;
          if (local_14a4 <= local_14b4) break;
          local_1800._8_8_ = uStack_1638;
          local_1800._0_8_ = local_1640;
          lStack_17f0 = uStack_1630;
          lStack_17e8 = uStack_1628;
          local_1840._8_8_ = uStack_15d8;
          local_1840._0_8_ = local_15e0;
          local_1840._16_8_ = uStack_15d0;
          local_1840._24_8_ = uStack_15c8;
          local_1860._8_8_ = uStack_15d8;
          local_1860._0_8_ = local_15e0;
          local_1860._16_8_ = uStack_15d0;
          local_1860._24_8_ = uStack_15c8;
          local_1880._8_8_ = uStack_15f8;
          local_1880._0_8_ = local_1600;
          local_1880._16_8_ = uStack_15f0;
          local_1880._24_8_ = uStack_15e8;
          local_1008 = local_1500 + (local_14d8 + -1);
          local_1010 = local_1510 + (local_14d8 + -1);
          local_1018 = local_1520 + (local_14d8 + -1);
          local_1020 = local_1530 + (local_14d8 + -1);
          auVar49 = ZEXT816(0) << 0x40;
          auVar5 = vpermq_avx2((undefined1  [32])*local_1008,0x90);
          auVar5 = vpblendd_avx2(auVar5,ZEXT1632(auVar49),3);
          auVar6 = vpermq_avx2((undefined1  [32])*local_1010,0x90);
          local_18e0 = (__m256i)vpblendd_avx2(auVar6,ZEXT1632(auVar49),3);
          auVar6 = vpermq_avx2((undefined1  [32])*local_1018,0x90);
          local_1900 = (__m256i)vpblendd_avx2(auVar6,ZEXT1632(auVar49),3);
          auVar6 = vpermq_avx2((undefined1  [32])*local_1020,0x90);
          local_1920 = (__m256i)vpblendd_avx2(auVar6,ZEXT1632(auVar49),3);
          local_18a0 = (__m256i)vpblendd_avx2(auVar5,ZEXT832((ulong)local_1560[local_14b4]),3);
          lVar44 = local_14e8 +
                   (long)(*(int *)(*(long *)(local_14d0 + 0x10) +
                                  (ulong)*(byte *)(local_14a0 + local_14b4) * 4) * local_14d8) *
                   0x20;
          lVar45 = local_14f0 +
                   (long)(*(int *)(*(long *)(local_14d0 + 0x10) +
                                  (ulong)*(byte *)(local_14a0 + local_14b4) * 4) * local_14d8) *
                   0x20;
          lVar46 = local_14f8 +
                   (long)(*(int *)(*(long *)(local_14d0 + 0x10) +
                                  (ulong)*(byte *)(local_14a0 + local_14b4) * 4) * local_14d8) *
                   0x20;
          local_1508 = local_1500;
          local_1500 = palVar43;
          local_1518 = local_1510;
          local_1510 = palVar42;
          local_1528 = local_1520;
          local_1520 = palVar41;
          local_1538 = local_1530;
          local_1530 = palVar40;
          for (local_14b0 = 0; local_14b0 < local_14d8; local_14b0 = local_14b0 + 1) {
            local_1028 = local_1540 + local_14b0;
            lVar61 = (*local_1028)[0];
            lVar77 = (*local_1028)[1];
            lVar78 = (*local_1028)[2];
            lVar74 = (*local_1028)[3];
            alVar7 = *local_1028;
            local_1030 = local_1548 + local_14b0;
            auVar37 = *(undefined1 (*) [24])*local_1030;
            lVar75 = (*local_1030)[3];
            alVar11 = *local_1030;
            alVar8 = *local_1030;
            local_1038 = local_1550 + local_14b0;
            auVar38 = *(undefined1 (*) [24])*local_1038;
            lVar76 = (*local_1038)[3];
            alVar12 = *local_1038;
            alVar9 = *local_1038;
            local_1040 = local_1558 + local_14b0;
            auVar39 = *(undefined1 (*) [24])*local_1040;
            lVar73 = (*local_1040)[3];
            alVar14 = *local_1040;
            alVar10 = *local_1040;
            local_1048 = (undefined1 (*) [32])(lVar44 + (long)local_14b0 * 0x20);
            local_d80 = *(undefined8 *)*local_1048;
            uStack_d78 = *(undefined8 *)(*local_1048 + 8);
            uStack_d70 = *(undefined8 *)(*local_1048 + 0x10);
            uStack_d68 = *(undefined8 *)(*local_1048 + 0x18);
            local_d60 = local_18a0[0];
            lStack_d58 = local_18a0[1];
            lStack_d50 = local_18a0[2];
            lStack_d48 = local_18a0[3];
            auVar5 = vpaddq_avx2((undefined1  [32])local_18a0,*local_1048);
            local_18c0 = auVar5._0_8_;
            lStack_18b8 = auVar5._8_8_;
            lStack_18b0 = auVar5._16_8_;
            lStack_18a8 = auVar5._24_8_;
            a[1] = in_stack_ffffffffffffe580;
            a[0] = in_stack_ffffffffffffe578;
            a[2] = in_stack_ffffffffffffe588;
            a[3] = in_stack_ffffffffffffe590;
            b[1] = in_stack_ffffffffffffe560;
            b[0] = in_stack_ffffffffffffe558;
            b[2] = in_stack_ffffffffffffe568;
            b[3] = in_stack_ffffffffffffe570;
            lVar47 = local_18c0;
            lVar55 = lStack_18b8;
            lVar57 = lStack_18b0;
            lVar59 = lStack_18a8;
            _mm256_max_epi64_rpl(a,b);
            a_00[1] = in_stack_ffffffffffffe580;
            a_00[0] = in_stack_ffffffffffffe578;
            a_00[2] = in_stack_ffffffffffffe588;
            a_00[3] = in_stack_ffffffffffffe590;
            b_00[1] = in_stack_ffffffffffffe560;
            b_00[0] = in_stack_ffffffffffffe558;
            b_00[2] = in_stack_ffffffffffffe568;
            b_00[3] = in_stack_ffffffffffffe570;
            _mm256_max_epi64_rpl(a_00,b_00);
            local_1148 = local_1500 + local_14b0;
            (*local_1148)[0] = lVar47;
            (*local_1148)[1] = lVar55;
            (*local_1148)[2] = lVar57;
            (*local_1148)[3] = lVar59;
            local_c40 = local_18c0;
            lStack_c38 = lStack_18b8;
            lStack_c30 = lStack_18b0;
            lStack_c28 = lStack_18a8;
            local_780 = -(ulong)(lVar47 == local_18c0);
            lStack_778 = -(ulong)(lVar55 == lStack_18b8);
            lStack_770 = -(ulong)(lVar57 == lStack_18b0);
            lStack_768 = -(ulong)(lVar59 == lStack_18a8);
            local_1980._8_8_ = lStack_778;
            local_1980._0_8_ = local_780;
            local_c80 = local_1800._0_8_;
            lStack_c78 = local_1800._8_8_;
            lStack_c70 = lStack_17f0;
            lStack_c68 = lStack_17e8;
            local_720 = -(ulong)(lVar47 == local_1800._0_8_);
            lStack_718 = -(ulong)(lVar55 == local_1800._8_8_);
            lStack_710 = -(ulong)(lVar57 == lStack_17f0);
            lStack_708 = -(ulong)(lVar59 == lStack_17e8);
            local_17a0 = auVar37._0_8_;
            lStack_1798 = auVar37._8_8_;
            lStack_1790 = auVar37._16_8_;
            local_560 = local_17a0;
            uStack_558 = lStack_1798;
            uStack_550 = lStack_1790;
            local_580 = local_1840._0_8_;
            uStack_578 = local_1840._8_8_;
            uStack_570 = local_1840._16_8_;
            uStack_568 = local_1840._24_8_;
            auVar22._8_8_ = lStack_718;
            auVar22._0_8_ = local_720;
            auVar22._16_8_ = lStack_710;
            auVar22._24_8_ = lStack_708;
            local_5c0 = vpblendvb_avx2((undefined1  [32])alVar8,local_1840,auVar22);
            local_1050 = (undefined1 (*) [32])(lVar45 + (long)local_14b0 * 0x20);
            local_dc0 = *(undefined8 *)*local_1050;
            uStack_db8 = *(undefined8 *)(*local_1050 + 8);
            uStack_db0 = *(undefined8 *)(*local_1050 + 0x10);
            uStack_da8 = *(undefined8 *)(*local_1050 + 0x18);
            local_da0 = local_18e0[0];
            lStack_d98 = local_18e0[1];
            lStack_d90 = local_18e0[2];
            lStack_d88 = local_18e0[3];
            local_5e0 = vpaddq_avx2((undefined1  [32])local_18e0,*local_1050);
            auVar21._16_8_ = lStack_770;
            auVar21._0_16_ = local_1980;
            auVar21._24_8_ = lStack_768;
            auVar5 = vpblendvb_avx2(local_5c0,local_5e0,auVar21);
            local_1188 = local_1510 + local_14b0;
            local_18e0[0] = auVar5._0_8_;
            local_18e0[1] = auVar5._8_8_;
            local_18e0[2] = auVar5._16_8_;
            local_18e0[3] = auVar5._24_8_;
            local_11c0 = local_18e0[0];
            lStack_11b8 = local_18e0[1];
            lStack_11b0 = local_18e0[2];
            lStack_11a8 = local_18e0[3];
            (*local_1188)[0] = local_18e0[0];
            (*local_1188)[1] = local_18e0[1];
            (*local_1188)[2] = local_18e0[2];
            (*local_1188)[3] = local_18e0[3];
            local_17c0 = auVar38._0_8_;
            lStack_17b8 = auVar38._8_8_;
            lStack_17b0 = auVar38._16_8_;
            local_620 = local_17c0;
            uStack_618 = lStack_17b8;
            uStack_610 = lStack_17b0;
            local_640 = local_1860._0_8_;
            uStack_638 = local_1860._8_8_;
            uStack_630 = local_1860._16_8_;
            uStack_628 = local_1860._24_8_;
            auVar4._8_8_ = lStack_718;
            auVar4._0_8_ = local_720;
            auVar4._16_8_ = lStack_710;
            auVar4._24_8_ = lStack_708;
            local_680 = vpblendvb_avx2((undefined1  [32])alVar9,local_1860,auVar4);
            local_1058 = (undefined1 (*) [32])(lVar46 + (long)local_14b0 * 0x20);
            local_e00 = *(undefined8 *)*local_1058;
            uStack_df8 = *(undefined8 *)(*local_1058 + 8);
            uStack_df0 = *(undefined8 *)(*local_1058 + 0x10);
            uStack_de8 = *(undefined8 *)(*local_1058 + 0x18);
            local_de0 = local_1900[0];
            lStack_dd8 = local_1900[1];
            lStack_dd0 = local_1900[2];
            lStack_dc8 = local_1900[3];
            local_6a0 = vpaddq_avx2((undefined1  [32])local_1900,*local_1058);
            auVar3._16_8_ = lStack_770;
            auVar3._0_16_ = local_1980;
            auVar3._24_8_ = lStack_768;
            auVar6 = vpblendvb_avx2(local_680,local_6a0,auVar3);
            local_11c8 = local_1520 + local_14b0;
            local_1900[0] = auVar6._0_8_;
            local_1900[1] = auVar6._8_8_;
            local_1900[2] = auVar6._16_8_;
            local_1900[3] = auVar6._24_8_;
            local_1200 = local_1900[0];
            lStack_11f8 = local_1900[1];
            lStack_11f0 = local_1900[2];
            lStack_11e8 = local_1900[3];
            (*local_11c8)[0] = local_1900[0];
            (*local_11c8)[1] = local_1900[1];
            (*local_11c8)[2] = local_1900[2];
            (*local_11c8)[3] = local_1900[3];
            local_17e0 = auVar39._0_8_;
            lStack_17d8 = auVar39._8_8_;
            lStack_17d0 = auVar39._16_8_;
            local_6e0 = local_17e0;
            uStack_6d8 = lStack_17d8;
            uStack_6d0 = lStack_17d0;
            local_700 = local_1880._0_8_;
            uStack_6f8 = local_1880._8_8_;
            uStack_6f0 = local_1880._16_8_;
            uStack_6e8 = local_1880._24_8_;
            auVar2._8_8_ = lStack_718;
            auVar2._0_8_ = local_720;
            auVar2._16_8_ = lStack_710;
            auVar2._24_8_ = lStack_708;
            local_740 = vpblendvb_avx2((undefined1  [32])alVar10,local_1880,auVar2);
            local_e20 = local_1920[0];
            lStack_e18 = local_1920[1];
            lStack_e10 = local_1920[2];
            lStack_e08 = local_1920[3];
            local_e40 = local_1600;
            uStack_e38 = uStack_15f8;
            uStack_e30 = uStack_15f0;
            uStack_e28 = uStack_15e8;
            auVar1._8_8_ = uStack_15f8;
            auVar1._0_8_ = local_1600;
            auVar1._16_8_ = uStack_15f0;
            auVar1._24_8_ = uStack_15e8;
            local_760 = vpaddq_avx2((undefined1  [32])local_1920,auVar1);
            auVar68._16_8_ = lStack_770;
            auVar68._0_16_ = local_1980;
            auVar68._24_8_ = lStack_768;
            auVar1 = vpblendvb_avx2(local_740,local_760,auVar68);
            local_1208 = local_1530 + local_14b0;
            local_1920[0] = auVar1._0_8_;
            local_1920[1] = auVar1._8_8_;
            local_1920[2] = auVar1._16_8_;
            local_1920[3] = auVar1._24_8_;
            local_1240 = local_1920[0];
            lStack_1238 = local_1920[1];
            lStack_1230 = local_1920[2];
            lStack_1228 = local_1920[3];
            (*local_1208)[0] = local_1920[0];
            (*local_1208)[1] = local_1920[1];
            (*local_1208)[2] = local_1920[2];
            (*local_1208)[3] = local_1920[3];
            a_01[1] = in_stack_ffffffffffffe580;
            a_01[0] = in_stack_ffffffffffffe578;
            a_01[2] = in_stack_ffffffffffffe588;
            a_01[3] = in_stack_ffffffffffffe590;
            b_01[1] = in_stack_ffffffffffffe560;
            b_01[0] = in_stack_ffffffffffffe558;
            b_01[2] = in_stack_ffffffffffffe568;
            b_01[3] = in_stack_ffffffffffffe570;
            local_1180 = lVar47;
            lStack_1178 = lVar55;
            lStack_1170 = lVar57;
            lStack_1168 = lVar59;
            local_c60 = lVar47;
            lStack_c58 = lVar55;
            lStack_c50 = lVar57;
            lStack_c48 = lVar59;
            local_c20 = lVar47;
            lStack_c18 = lVar55;
            lStack_c10 = lVar57;
            lStack_c08 = lVar59;
            lStack_6c8 = lVar73;
            local_6c0 = local_780;
            lStack_6b8 = lStack_778;
            lStack_6b0 = lStack_770;
            lStack_6a8 = lStack_768;
            local_660 = local_720;
            lStack_658 = lStack_718;
            lStack_650 = lStack_710;
            lStack_648 = lStack_708;
            lStack_608 = lVar76;
            local_600 = local_780;
            lStack_5f8 = lStack_778;
            lStack_5f0 = lStack_770;
            lStack_5e8 = lStack_768;
            local_5a0 = local_720;
            lStack_598 = lStack_718;
            lStack_590 = lStack_710;
            lStack_588 = lStack_708;
            lStack_548 = lVar75;
            auVar49 = local_1680;
            auVar50 = auStack_1670;
            _mm256_min_epi64_rpl(a_01,b_01);
            a_02[1] = in_stack_ffffffffffffe580;
            a_02[0] = in_stack_ffffffffffffe578;
            a_02[2] = in_stack_ffffffffffffe588;
            a_02[3] = in_stack_ffffffffffffe590;
            b_02[1] = in_stack_ffffffffffffe560;
            b_02[0] = in_stack_ffffffffffffe558;
            b_02[2] = in_stack_ffffffffffffe568;
            b_02[3] = in_stack_ffffffffffffe570;
            local_1680 = auVar49;
            auStack_1670 = auVar50;
            _mm256_max_epi64_rpl(a_02,b_02);
            a_03[1] = in_stack_ffffffffffffe580;
            a_03[0] = in_stack_ffffffffffffe578;
            a_03[2] = in_stack_ffffffffffffe588;
            a_03[3] = in_stack_ffffffffffffe590;
            b_03[1] = in_stack_ffffffffffffe560;
            b_03[0] = in_stack_ffffffffffffe558;
            b_03[2] = in_stack_ffffffffffffe568;
            b_03[3] = in_stack_ffffffffffffe570;
            _mm256_max_epi64_rpl(a_03,b_03);
            a_04[1] = in_stack_ffffffffffffe580;
            a_04[0] = in_stack_ffffffffffffe578;
            a_04[2] = in_stack_ffffffffffffe588;
            a_04[3] = in_stack_ffffffffffffe590;
            b_04[1] = in_stack_ffffffffffffe560;
            b_04[0] = in_stack_ffffffffffffe558;
            b_04[2] = in_stack_ffffffffffffe568;
            b_04[3] = in_stack_ffffffffffffe570;
            _mm256_max_epi64_rpl(a_04,b_04);
            a_05[1] = in_stack_ffffffffffffe580;
            a_05[0] = in_stack_ffffffffffffe578;
            a_05[2] = in_stack_ffffffffffffe588;
            a_05[3] = in_stack_ffffffffffffe590;
            b_05[1] = in_stack_ffffffffffffe560;
            b_05[0] = in_stack_ffffffffffffe558;
            b_05[2] = in_stack_ffffffffffffe568;
            b_05[3] = in_stack_ffffffffffffe570;
            _mm256_max_epi64_rpl(a_05,b_05);
            vH_00[1] = in_stack_ffffffffffffe520;
            vH_00[0] = in_stack_ffffffffffffe518;
            vH_00[2] = in_stack_ffffffffffffe528;
            vH_00[3] = in_stack_ffffffffffffe530;
            arr_store_si256(in_stack_ffffffffffffe540,vH_00,in_stack_ffffffffffffe514,
                            in_stack_ffffffffffffe510,in_stack_ffffffffffffe50c,
                            in_stack_ffffffffffffe508);
            vH_01[1] = in_stack_ffffffffffffe520;
            vH_01[0] = in_stack_ffffffffffffe518;
            vH_01[2] = in_stack_ffffffffffffe528;
            vH_01[3] = in_stack_ffffffffffffe530;
            arr_store_si256(in_stack_ffffffffffffe540,vH_01,in_stack_ffffffffffffe514,
                            in_stack_ffffffffffffe510,in_stack_ffffffffffffe50c,
                            in_stack_ffffffffffffe508);
            vH_02[1] = in_stack_ffffffffffffe520;
            vH_02[0] = in_stack_ffffffffffffe518;
            vH_02[2] = in_stack_ffffffffffffe528;
            vH_02[3] = in_stack_ffffffffffffe530;
            arr_store_si256(in_stack_ffffffffffffe540,vH_02,in_stack_ffffffffffffe514,
                            in_stack_ffffffffffffe510,in_stack_ffffffffffffe50c,
                            in_stack_ffffffffffffe508);
            vH_03[1] = in_stack_ffffffffffffe520;
            vH_03[0] = in_stack_ffffffffffffe518;
            vH_03[2] = in_stack_ffffffffffffe528;
            vH_03[3] = in_stack_ffffffffffffe530;
            arr_store_si256(in_stack_ffffffffffffe540,vH_03,in_stack_ffffffffffffe514,
                            in_stack_ffffffffffffe510,in_stack_ffffffffffffe50c,
                            in_stack_ffffffffffffe508);
            local_440 = local_1580;
            uStack_438 = uStack_1578;
            uStack_430 = uStack_1570;
            uStack_428 = uStack_1568;
            auVar29._16_8_ = lVar57;
            auVar29._0_8_ = lVar47;
            auVar29._8_8_ = lVar55;
            auVar29._24_8_ = lVar59;
            auVar28._8_8_ = uStack_1578;
            auVar28._0_8_ = local_1580;
            auVar28._16_8_ = uStack_1570;
            auVar28._24_8_ = uStack_1568;
            auVar4 = vpsubq_avx2(auVar29,auVar28);
            auVar27._16_8_ = auStack_1590._0_8_;
            auVar27._0_16_ = local_15a0;
            auVar27._24_8_ = auStack_1590._8_8_;
            auVar68 = vpsubq_avx2((undefined1  [32])alVar7,auVar27);
            local_1740 = auVar4._0_8_;
            lStack_1738 = auVar4._8_8_;
            lStack_1730 = auVar4._16_8_;
            lStack_1728 = auVar4._24_8_;
            a_06[1] = in_stack_ffffffffffffe580;
            a_06[0] = in_stack_ffffffffffffe578;
            a_06[2] = in_stack_ffffffffffffe588;
            a_06[3] = in_stack_ffffffffffffe590;
            b_06[1] = in_stack_ffffffffffffe560;
            b_06[0] = in_stack_ffffffffffffe558;
            b_06[2] = in_stack_ffffffffffffe568;
            b_06[3] = in_stack_ffffffffffffe570;
            lVar48 = local_1740;
            lVar56 = lStack_1738;
            lVar58 = lStack_1730;
            lVar60 = lStack_1728;
            local_460 = lVar61;
            lStack_458 = lVar77;
            lStack_450 = lVar78;
            lStack_448 = lVar74;
            local_420 = lVar47;
            lStack_418 = lVar55;
            lStack_410 = lVar57;
            lStack_408 = lVar59;
            local_480 = local_15a0;
            auStack_470 = auStack_1590;
            _mm256_max_epi64_rpl(a_06,b_06);
            local_1780 = auVar68._0_8_;
            uStack_1778 = auVar68._8_8_;
            uStack_1770 = auVar68._16_8_;
            uStack_1768 = auVar68._24_8_;
            local_2a0 = local_1740;
            lStack_298 = lStack_1738;
            lStack_290 = lStack_1730;
            lStack_288 = lStack_1728;
            local_2c0 = local_1780;
            uStack_2b8 = uStack_1778;
            uStack_2b0 = uStack_1770;
            uStack_2a8 = uStack_1768;
            auVar3 = vpcmpgtq_avx2(auVar4,auVar68);
            local_1980._0_8_ = auVar3._0_8_;
            local_1980._8_8_ = auVar3._8_8_;
            uStack_1970 = auVar3._16_8_;
            uStack_1968 = auVar3._24_8_;
            local_7a0 = local_17a0;
            uStack_798 = lStack_1798;
            uStack_790 = lStack_1790;
            local_7c0 = local_18e0[0];
            lStack_7b8 = local_18e0[1];
            lStack_7b0 = local_18e0[2];
            lStack_7a8 = local_18e0[3];
            local_7e0 = local_1980._0_8_;
            uStack_7d8 = local_1980._8_8_;
            uStack_7d0 = uStack_1970;
            uStack_7c8 = uStack_1968;
            auVar68 = vpblendvb_avx2((undefined1  [32])alVar11,auVar5,auVar3);
            local_800 = local_17c0;
            uStack_7f8 = lStack_17b8;
            uStack_7f0 = lStack_17b0;
            local_820 = local_1900[0];
            lStack_818 = local_1900[1];
            lStack_810 = local_1900[2];
            lStack_808 = local_1900[3];
            local_840 = local_1980._0_8_;
            uStack_838 = local_1980._8_8_;
            uStack_830 = uStack_1970;
            uStack_828 = uStack_1968;
            auVar2 = vpblendvb_avx2((undefined1  [32])alVar12,auVar6,auVar3);
            local_e60 = local_17e0;
            uStack_e58 = lStack_17d8;
            uStack_e50 = lStack_17d0;
            local_e80 = local_1600;
            uStack_e78 = uStack_15f8;
            uStack_e70 = uStack_15f0;
            uStack_e68 = uStack_15e8;
            auVar20._8_8_ = uStack_15f8;
            auVar20._0_8_ = local_1600;
            auVar20._16_8_ = uStack_15f0;
            auVar20._24_8_ = uStack_15e8;
            local_860 = vpaddq_avx2((undefined1  [32])alVar14,auVar20);
            local_ea0 = local_1920[0];
            lStack_e98 = local_1920[1];
            lStack_e90 = local_1920[2];
            lStack_e88 = local_1920[3];
            local_ec0 = local_1600;
            uStack_eb8 = uStack_15f8;
            uStack_eb0 = uStack_15f0;
            uStack_ea8 = uStack_15e8;
            auVar19._8_8_ = uStack_15f8;
            auVar19._0_8_ = local_1600;
            auVar19._16_8_ = uStack_15f0;
            auVar19._24_8_ = uStack_15e8;
            local_880 = vpaddq_avx2(auVar1,auVar19);
            local_8a0 = local_1980._0_8_;
            uStack_898 = local_1980._8_8_;
            uStack_890 = uStack_1970;
            uStack_888 = uStack_1968;
            auVar3 = vpblendvb_avx2(local_860,local_880,auVar3);
            local_1248 = local_1540 + local_14b0;
            (*local_1248)[0] = lVar48;
            (*local_1248)[1] = lVar56;
            (*local_1248)[2] = lVar58;
            (*local_1248)[3] = lVar60;
            local_1288 = local_1548 + local_14b0;
            local_17a0 = auVar68._0_8_;
            lStack_1798 = auVar68._8_8_;
            lStack_1790 = auVar68._16_8_;
            lStack_1788 = auVar68._24_8_;
            local_12c0 = local_17a0;
            lStack_12b8 = lStack_1798;
            lStack_12b0 = lStack_1790;
            lStack_12a8 = lStack_1788;
            (*local_1288)[0] = local_17a0;
            (*local_1288)[1] = lStack_1798;
            (*local_1288)[2] = lStack_1790;
            (*local_1288)[3] = lStack_1788;
            local_12c8 = local_1550 + local_14b0;
            local_17c0 = auVar2._0_8_;
            lStack_17b8 = auVar2._8_8_;
            lStack_17b0 = auVar2._16_8_;
            lStack_17a8 = auVar2._24_8_;
            local_1300 = local_17c0;
            lStack_12f8 = lStack_17b8;
            lStack_12f0 = lStack_17b0;
            lStack_12e8 = lStack_17a8;
            (*local_12c8)[0] = local_17c0;
            (*local_12c8)[1] = lStack_17b8;
            (*local_12c8)[2] = lStack_17b0;
            (*local_12c8)[3] = lStack_17a8;
            local_1308 = local_1558 + local_14b0;
            local_17e0 = auVar3._0_8_;
            lStack_17d8 = auVar3._8_8_;
            lStack_17d0 = auVar3._16_8_;
            lStack_17c8 = auVar3._24_8_;
            local_1340 = local_17e0;
            lStack_1338 = lStack_17d8;
            lStack_1330 = lStack_17d0;
            lStack_1328 = lStack_17c8;
            (*local_1308)[0] = local_17e0;
            (*local_1308)[1] = lStack_17d8;
            (*local_1308)[2] = lStack_17d0;
            (*local_1308)[3] = lStack_17c8;
            local_4a0 = local_1800._0_8_;
            lStack_498 = local_1800._8_8_;
            lStack_490 = lStack_17f0;
            lStack_488 = lStack_17e8;
            auVar26._16_8_ = auStack_1590._0_8_;
            auVar26._0_16_ = local_15a0;
            auVar26._24_8_ = auStack_1590._8_8_;
            auVar68 = vpsubq_avx2(_local_1800,auVar26);
            a_07[1] = in_stack_ffffffffffffe580;
            a_07[0] = in_stack_ffffffffffffe578;
            a_07[2] = in_stack_ffffffffffffe588;
            a_07[3] = in_stack_ffffffffffffe590;
            alVar14[1] = in_stack_ffffffffffffe560;
            alVar14[0] = in_stack_ffffffffffffe558;
            alVar14[2] = in_stack_ffffffffffffe568;
            alVar14[3] = in_stack_ffffffffffffe570;
            local_1800._0_8_ = local_1740;
            local_1800._8_8_ = lStack_1738;
            lStack_17f0 = lStack_1730;
            lStack_17e8 = lStack_1728;
            local_1280 = lVar48;
            lStack_1278 = lVar56;
            lStack_1270 = lVar58;
            lStack_1268 = lVar60;
            lStack_e48 = lVar73;
            lStack_7e8 = lVar76;
            lStack_788 = lVar75;
            local_4c0 = local_15a0;
            auStack_4b0 = auStack_1590;
            _mm256_max_epi64_rpl(a_07,alVar14);
            local_2e0 = local_1740;
            lStack_2d8 = lStack_1738;
            lStack_2d0 = lStack_1730;
            lStack_2c8 = lStack_1728;
            local_1820 = auVar68._0_8_;
            local_300 = local_1820;
            lStack_1818 = auVar68._8_8_;
            uStack_2f8 = lStack_1818;
            lStack_1810 = auVar68._16_8_;
            uStack_2f0 = lStack_1810;
            lStack_1808 = auVar68._24_8_;
            uStack_2e8 = lStack_1808;
            auVar68 = vpcmpgtq_avx2(auVar4,auVar68);
            local_8c0 = local_1840._0_8_;
            uStack_8b8 = local_1840._8_8_;
            uStack_8b0 = local_1840._16_8_;
            uStack_8a8 = local_1840._24_8_;
            local_8e0 = local_18e0[0];
            lStack_8d8 = local_18e0[1];
            lStack_8d0 = local_18e0[2];
            lStack_8c8 = local_18e0[3];
            local_1980._0_8_ = auVar68._0_8_;
            local_900 = local_1980._0_8_;
            local_1980._8_8_ = auVar68._8_8_;
            uStack_8f8 = local_1980._8_8_;
            uStack_1970 = auVar68._16_8_;
            uStack_8f0 = uStack_1970;
            uStack_1968 = auVar68._24_8_;
            uStack_8e8 = uStack_1968;
            local_1840 = vpblendvb_avx2(local_1840,auVar5,auVar68);
            local_920 = local_1860._0_8_;
            uStack_918 = local_1860._8_8_;
            uStack_910 = local_1860._16_8_;
            uStack_908 = local_1860._24_8_;
            local_940 = local_1900[0];
            lStack_938 = local_1900[1];
            lStack_930 = local_1900[2];
            lStack_928 = local_1900[3];
            local_960 = local_1980._0_8_;
            uStack_958 = local_1980._8_8_;
            uStack_950 = uStack_1970;
            uStack_948 = uStack_1968;
            local_1860 = vpblendvb_avx2(local_1860,auVar6,auVar68);
            local_ee0 = local_1880._0_8_;
            uStack_ed8 = local_1880._8_8_;
            uStack_ed0 = local_1880._16_8_;
            uStack_ec8 = local_1880._24_8_;
            local_f00 = local_1600;
            uStack_ef8 = uStack_15f8;
            uStack_ef0 = uStack_15f0;
            uStack_ee8 = uStack_15e8;
            auVar6._8_8_ = uStack_15f8;
            auVar6._0_8_ = local_1600;
            auVar6._16_8_ = uStack_15f0;
            auVar6._24_8_ = uStack_15e8;
            local_980 = vpaddq_avx2(local_1880,auVar6);
            local_f20 = local_1920[0];
            lStack_f18 = local_1920[1];
            lStack_f10 = local_1920[2];
            lStack_f08 = local_1920[3];
            local_f40 = local_1600;
            uStack_f38 = uStack_15f8;
            uStack_f30 = uStack_15f0;
            uStack_f28 = uStack_15e8;
            auVar5._8_8_ = uStack_15f8;
            auVar5._0_8_ = local_1600;
            auVar5._16_8_ = uStack_15f0;
            auVar5._24_8_ = uStack_15e8;
            local_9a0 = vpaddq_avx2(auVar1,auVar5);
            local_9c0 = local_1980._0_8_;
            uStack_9b8 = local_1980._8_8_;
            uStack_9b0 = uStack_1970;
            uStack_9a8 = uStack_1968;
            local_1880 = vpblendvb_avx2(local_980,local_9a0,auVar68);
            local_1060 = local_1508 + local_14b0;
            local_18a0 = *local_1060;
            local_1068 = local_1518 + local_14b0;
            local_18e0 = *local_1068;
            local_1070 = local_1528 + local_14b0;
            local_1900 = *local_1070;
            local_1078 = local_1538 + local_14b0;
            local_1920 = *local_1078;
          }
          for (local_14b8 = 0; local_14b8 < local_14d4; local_14b8 = local_14b8 + 1) {
            local_1080 = local_1508 + (local_14d8 + -1);
            in_stack_ffffffffffffe518 = local_1560[local_14b4 + 1] - (long)local_14a8;
            if (in_stack_ffffffffffffe518 < -0x8000000000000000) {
              in_stack_ffffffffffffe518 = -0x8000000000000000;
            }
            auVar49 = ZEXT816(0) << 0x40;
            auVar5 = vpermq_avx2((undefined1  [32])*local_1080,0x90);
            auVar5 = vpblendd_avx2(auVar5,ZEXT1632(auVar49),3);
            auVar6 = vpermq_avx2(_local_1800,0x90);
            auVar6 = vpblendd_avx2(auVar6,ZEXT1632(auVar49),3);
            auVar1 = vpermq_avx2(local_1840,0x90);
            auVar68 = ZEXT1632(auVar49);
            local_1840 = vpblendd_avx2(auVar1,auVar68,3);
            auVar1 = vpermq_avx2(local_1860,0x90);
            local_1860 = vpblendd_avx2(auVar1,auVar68,3);
            auVar1 = vpermq_avx2(local_1880,0x90);
            auVar1 = vpblendd_avx2(auVar1,auVar68,3);
            stack0xffffffffffffe648 = auVar5._8_24_;
            local_19c0._0_8_ = local_1560[local_14b4];
            stack0xffffffffffffe808 = auVar6._8_24_;
            local_1800._0_8_ = in_stack_ffffffffffffe518;
            local_1880 = vpblendd_avx2(auVar1,ZEXT1632(SUB6416(ZEXT864(1),0)),3);
            for (local_14b0 = 0; local_14b0 < local_14d8; local_14b0 = local_14b0 + 1) {
              local_1088 = (undefined1 (*) [32])(lVar44 + (long)local_14b0 * 0x20);
              local_f80 = *(undefined8 *)*local_1088;
              uStack_f78 = *(undefined8 *)(*local_1088 + 8);
              uStack_f70 = *(undefined8 *)(*local_1088 + 0x10);
              uStack_f68 = *(undefined8 *)(*local_1088 + 0x18);
              local_f60 = local_19c0._0_8_;
              lStack_f58 = local_19c0._8_8_;
              lStack_f50 = lStack_19b0;
              lStack_f48 = lStack_19a8;
              auVar5 = vpaddq_avx2((undefined1  [32])_local_19c0,*local_1088);
              local_1090 = local_1500 + local_14b0;
              auVar37 = *(undefined1 (*) [24])*local_1090;
              lVar61 = (*local_1090)[3];
              local_18a0[0] = auVar37._0_8_;
              local_18a0[1] = auVar37._8_8_;
              local_18a0[2] = auVar37._16_8_;
              a_08[1] = in_stack_ffffffffffffe580;
              a_08[0] = in_stack_ffffffffffffe578;
              a_08[2] = in_stack_ffffffffffffe588;
              a_08[3] = in_stack_ffffffffffffe590;
              b_07[1] = in_stack_ffffffffffffe560;
              b_07[0] = in_stack_ffffffffffffe558;
              b_07[2] = in_stack_ffffffffffffe568;
              b_07[3] = in_stack_ffffffffffffe570;
              _mm256_max_epi64_rpl(a_08,b_07);
              local_1348 = local_1500 + local_14b0;
              (*local_1348)[0] = local_18a0[0];
              (*local_1348)[1] = local_18a0[1];
              (*local_1348)[2] = local_18a0[2];
              (*local_1348)[3] = lVar61;
              local_19c0._0_8_ = auVar5._0_8_;
              local_19c0._8_8_ = auVar5._8_8_;
              lStack_19b0 = auVar5._16_8_;
              lStack_19a8 = auVar5._24_8_;
              local_cc0 = local_19c0._0_8_;
              lStack_cb8 = local_19c0._8_8_;
              lStack_cb0 = lStack_19b0;
              lStack_ca8 = lStack_19a8;
              local_260 = -(ulong)(local_18a0[0] == local_19c0._0_8_);
              lStack_258 = -(ulong)(local_18a0[1] == local_19c0._8_8_);
              lStack_250 = -(ulong)(local_18a0[2] == lStack_19b0);
              lStack_248 = -(ulong)(lVar61 == lStack_19a8);
              local_d00 = local_1800._0_8_;
              lStack_cf8 = local_1800._8_8_;
              lStack_cf0 = lStack_17f0;
              lStack_ce8 = lStack_17e8;
              local_280 = -(ulong)(local_18a0[0] == local_1800._0_8_);
              lStack_278 = -(ulong)(local_18a0[1] == local_1800._8_8_);
              lStack_270 = -(ulong)(local_18a0[2] == lStack_17f0);
              lStack_268 = -(ulong)(lVar61 == lStack_17e8);
              auVar35._8_8_ = lStack_258;
              auVar35._0_8_ = local_260;
              auVar35._16_8_ = lStack_250;
              auVar35._24_8_ = lStack_248;
              auVar34._8_8_ = lStack_278;
              auVar34._0_8_ = local_280;
              auVar34._16_8_ = lStack_270;
              auVar34._24_8_ = lStack_268;
              auVar5 = vpandn_avx2(auVar35,auVar34);
              local_1098 = local_1510 + local_14b0;
              auVar37 = *(undefined1 (*) [24])*local_1098;
              lStack_9c8 = (*local_1098)[3];
              local_18e0[0] = auVar37._0_8_;
              local_18e0[1] = auVar37._8_8_;
              local_18e0[2] = auVar37._16_8_;
              local_1a40 = auVar5._0_8_;
              uStack_1a38 = auVar5._8_8_;
              uStack_1a30 = auVar5._16_8_;
              uStack_1a28 = auVar5._24_8_;
              local_9e0 = local_18e0[0];
              uStack_9d8 = local_18e0[1];
              uStack_9d0 = local_18e0[2];
              local_a00 = local_1840._0_8_;
              uStack_9f8 = local_1840._8_8_;
              uStack_9f0 = local_1840._16_8_;
              uStack_9e8 = local_1840._24_8_;
              local_a20 = local_1a40;
              uStack_a18 = uStack_1a38;
              uStack_a10 = uStack_1a30;
              uStack_a08 = uStack_1a28;
              auVar6 = vpblendvb_avx2((undefined1  [32])*local_1098,local_1840,auVar5);
              local_1388 = local_1510 + local_14b0;
              local_18e0[0] = auVar6._0_8_;
              local_18e0[1] = auVar6._8_8_;
              local_18e0[2] = auVar6._16_8_;
              local_18e0[3] = auVar6._24_8_;
              local_13c0 = local_18e0[0];
              lStack_13b8 = local_18e0[1];
              lStack_13b0 = local_18e0[2];
              lStack_13a8 = local_18e0[3];
              (*local_1388)[0] = local_18e0[0];
              (*local_1388)[1] = local_18e0[1];
              (*local_1388)[2] = local_18e0[2];
              (*local_1388)[3] = local_18e0[3];
              local_10a0 = local_1520 + local_14b0;
              auVar37 = *(undefined1 (*) [24])*local_10a0;
              lStack_a28 = (*local_10a0)[3];
              local_1900[0] = auVar37._0_8_;
              local_1900[1] = auVar37._8_8_;
              local_1900[2] = auVar37._16_8_;
              local_a40 = local_1900[0];
              uStack_a38 = local_1900[1];
              uStack_a30 = local_1900[2];
              local_a60 = local_1860._0_8_;
              uStack_a58 = local_1860._8_8_;
              uStack_a50 = local_1860._16_8_;
              uStack_a48 = local_1860._24_8_;
              local_a80 = local_1a40;
              uStack_a78 = uStack_1a38;
              uStack_a70 = uStack_1a30;
              uStack_a68 = uStack_1a28;
              auVar1 = vpblendvb_avx2((undefined1  [32])*local_10a0,local_1860,auVar5);
              local_13c8 = local_1520 + local_14b0;
              local_1900[0] = auVar1._0_8_;
              local_1900[1] = auVar1._8_8_;
              local_1900[2] = auVar1._16_8_;
              local_1900[3] = auVar1._24_8_;
              local_1400 = local_1900[0];
              lStack_13f8 = local_1900[1];
              lStack_13f0 = local_1900[2];
              lStack_13e8 = local_1900[3];
              (*local_13c8)[0] = local_1900[0];
              (*local_13c8)[1] = local_1900[1];
              (*local_13c8)[2] = local_1900[2];
              (*local_13c8)[3] = local_1900[3];
              local_10a8 = local_1530 + local_14b0;
              auVar37 = *(undefined1 (*) [24])*local_10a8;
              lStack_a88 = (*local_10a8)[3];
              local_1920[0] = auVar37._0_8_;
              local_1920[1] = auVar37._8_8_;
              local_1920[2] = auVar37._16_8_;
              local_aa0 = local_1920[0];
              uStack_a98 = local_1920[1];
              uStack_a90 = local_1920[2];
              local_ac0 = local_1880._0_8_;
              uStack_ab8 = local_1880._8_8_;
              uStack_ab0 = local_1880._16_8_;
              uStack_aa8 = local_1880._24_8_;
              local_ae0 = local_1a40;
              uStack_ad8 = uStack_1a38;
              uStack_ad0 = uStack_1a30;
              uStack_ac8 = uStack_1a28;
              auVar5 = vpblendvb_avx2((undefined1  [32])*local_10a8,local_1880,auVar5);
              local_1408 = local_1530 + local_14b0;
              local_1920[0] = auVar5._0_8_;
              local_1920[1] = auVar5._8_8_;
              local_1920[2] = auVar5._16_8_;
              local_1920[3] = auVar5._24_8_;
              local_1440 = local_1920[0];
              lStack_1438 = local_1920[1];
              lStack_1430 = local_1920[2];
              lStack_1428 = local_1920[3];
              (*local_1408)[0] = local_1920[0];
              (*local_1408)[1] = local_1920[1];
              (*local_1408)[2] = local_1920[2];
              (*local_1408)[3] = local_1920[3];
              a_09[1] = in_stack_ffffffffffffe580;
              a_09[0] = in_stack_ffffffffffffe578;
              a_09[2] = in_stack_ffffffffffffe588;
              a_09[3] = in_stack_ffffffffffffe590;
              b_08[1] = in_stack_ffffffffffffe560;
              b_08[0] = in_stack_ffffffffffffe558;
              b_08[2] = in_stack_ffffffffffffe568;
              b_08[3] = in_stack_ffffffffffffe570;
              local_1380 = local_18a0[0];
              lStack_1378 = local_18a0[1];
              lStack_1370 = local_18a0[2];
              lStack_1368 = lVar61;
              local_ce0 = local_18a0[0];
              lStack_cd8 = local_18a0[1];
              lStack_cd0 = local_18a0[2];
              lStack_cc8 = lVar61;
              local_ca0 = local_18a0[0];
              lStack_c98 = local_18a0[1];
              lStack_c90 = local_18a0[2];
              lStack_c88 = lVar61;
              auVar49 = local_1680;
              auVar50 = auStack_1670;
              _mm256_min_epi64_rpl(a_09,b_08);
              a_10[1] = in_stack_ffffffffffffe580;
              a_10[0] = in_stack_ffffffffffffe578;
              a_10[2] = in_stack_ffffffffffffe588;
              a_10[3] = in_stack_ffffffffffffe590;
              b_09[1] = in_stack_ffffffffffffe560;
              b_09[0] = in_stack_ffffffffffffe558;
              b_09[2] = in_stack_ffffffffffffe568;
              b_09[3] = in_stack_ffffffffffffe570;
              local_1680 = auVar49;
              auStack_1670 = auVar50;
              _mm256_max_epi64_rpl(a_10,b_09);
              a_11[1] = in_stack_ffffffffffffe580;
              a_11[0] = in_stack_ffffffffffffe578;
              a_11[2] = in_stack_ffffffffffffe588;
              a_11[3] = in_stack_ffffffffffffe590;
              b_10[1] = in_stack_ffffffffffffe560;
              b_10[0] = in_stack_ffffffffffffe558;
              b_10[2] = in_stack_ffffffffffffe568;
              b_10[3] = in_stack_ffffffffffffe570;
              _mm256_max_epi64_rpl(a_11,b_10);
              a_12[1] = in_stack_ffffffffffffe580;
              a_12[0] = in_stack_ffffffffffffe578;
              a_12[2] = in_stack_ffffffffffffe588;
              a_12[3] = in_stack_ffffffffffffe590;
              b_11[1] = in_stack_ffffffffffffe560;
              b_11[0] = in_stack_ffffffffffffe558;
              b_11[2] = in_stack_ffffffffffffe568;
              b_11[3] = in_stack_ffffffffffffe570;
              _mm256_max_epi64_rpl(a_12,b_11);
              a_13[1] = in_stack_ffffffffffffe580;
              a_13[0] = in_stack_ffffffffffffe578;
              a_13[2] = in_stack_ffffffffffffe588;
              a_13[3] = in_stack_ffffffffffffe590;
              b_12[1] = in_stack_ffffffffffffe560;
              b_12[0] = in_stack_ffffffffffffe558;
              b_12[2] = in_stack_ffffffffffffe568;
              b_12[3] = in_stack_ffffffffffffe570;
              _mm256_max_epi64_rpl(a_13,b_12);
              vH_04[1] = in_stack_ffffffffffffe520;
              vH_04[0] = in_stack_ffffffffffffe518;
              vH_04[2] = in_stack_ffffffffffffe528;
              vH_04[3] = in_stack_ffffffffffffe530;
              arr_store_si256(in_stack_ffffffffffffe540,vH_04,in_stack_ffffffffffffe514,
                              in_stack_ffffffffffffe510,in_stack_ffffffffffffe50c,
                              in_stack_ffffffffffffe508);
              vH_05[1] = in_stack_ffffffffffffe520;
              vH_05[0] = in_stack_ffffffffffffe518;
              vH_05[2] = in_stack_ffffffffffffe528;
              vH_05[3] = in_stack_ffffffffffffe530;
              arr_store_si256(in_stack_ffffffffffffe540,vH_05,in_stack_ffffffffffffe514,
                              in_stack_ffffffffffffe510,in_stack_ffffffffffffe50c,
                              in_stack_ffffffffffffe508);
              vH_06[1] = in_stack_ffffffffffffe520;
              vH_06[0] = in_stack_ffffffffffffe518;
              vH_06[2] = in_stack_ffffffffffffe528;
              vH_06[3] = in_stack_ffffffffffffe530;
              arr_store_si256(in_stack_ffffffffffffe540,vH_06,in_stack_ffffffffffffe514,
                              in_stack_ffffffffffffe510,in_stack_ffffffffffffe50c,
                              in_stack_ffffffffffffe508);
              vH_07[1] = in_stack_ffffffffffffe520;
              vH_07[0] = in_stack_ffffffffffffe518;
              vH_07[2] = in_stack_ffffffffffffe528;
              vH_07[3] = in_stack_ffffffffffffe530;
              arr_store_si256(in_stack_ffffffffffffe540,vH_07,in_stack_ffffffffffffe514,
                              in_stack_ffffffffffffe510,in_stack_ffffffffffffe50c,
                              in_stack_ffffffffffffe508);
              local_500 = local_1580;
              uStack_4f8 = uStack_1578;
              uStack_4f0 = uStack_1570;
              uStack_4e8 = uStack_1568;
              auVar25._16_8_ = local_18a0[2];
              auVar25._0_8_ = local_18a0[0];
              auVar25._8_8_ = local_18a0[1];
              auVar25._24_8_ = lVar61;
              auVar24._8_8_ = uStack_1578;
              auVar24._0_8_ = local_1580;
              auVar24._16_8_ = uStack_1570;
              auVar24._24_8_ = uStack_1568;
              auVar68 = vpsubq_avx2(auVar25,auVar24);
              local_520 = local_1800._0_8_;
              lStack_518 = local_1800._8_8_;
              lStack_510 = lStack_17f0;
              lStack_508 = lStack_17e8;
              auVar23._16_8_ = auStack_1590._0_8_;
              auVar23._0_16_ = local_15a0;
              auVar23._24_8_ = auStack_1590._8_8_;
              _local_1800 = vpsubq_avx2(_local_1800,auVar23);
              local_1820 = local_1800._0_8_;
              local_320 = local_1820;
              lStack_1818 = local_1800._8_8_;
              lStack_318 = lStack_1818;
              lStack_1810 = local_1800._16_8_;
              lStack_310 = lStack_1810;
              lStack_1808 = local_1800._24_8_;
              lStack_308 = lStack_1808;
              local_1740 = auVar68._0_8_;
              local_340 = local_1740;
              lStack_1738 = auVar68._8_8_;
              lStack_338 = lStack_1738;
              lStack_1730 = auVar68._16_8_;
              lStack_330 = lStack_1730;
              lStack_1728 = auVar68._24_8_;
              lStack_328 = lStack_1728;
              local_1a0 = vpcmpgtq_avx2(_local_1800,auVar68);
              local_d20 = local_1820;
              lStack_d18 = lStack_1818;
              lStack_d10 = lStack_1810;
              lStack_d08 = lStack_1808;
              local_d40 = local_1740;
              lStack_d38 = lStack_1738;
              lStack_d30 = lStack_1730;
              lStack_d28 = lStack_1728;
              local_1c0 = -(ulong)(local_1820 == local_1740);
              lStack_1b8 = -(ulong)(lStack_1818 == lStack_1738);
              lStack_1b0 = -(ulong)(lStack_1810 == lStack_1730);
              lStack_1a8 = -(ulong)(lStack_1808 == lStack_1728);
              auVar36._8_8_ = lStack_1b8;
              auVar36._0_8_ = local_1c0;
              auVar36._16_8_ = lStack_1b0;
              auVar36._24_8_ = lStack_1a8;
              local_220 = vpor_avx2(local_1a0,auVar36);
              local_4e0 = local_18a0[0];
              lStack_4d8 = local_18a0[1];
              lStack_4d0 = local_18a0[2];
              lStack_4c8 = lVar61;
              auStack_530 = auStack_1590;
              local_540 = local_15a0;
              if ((((((((((((((((((((((((((((((((local_220 >> 7 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0 &&
                                               (local_220 >> 0xf & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (local_220 >> 0x17 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (local_220 >> 0x1f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (local_220 >> 0x27 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (local_220 >> 0x2f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (local_220 >> 0x37 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (local_220 >> 0x3f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (local_220 >> 0x47 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) &&
                                       (local_220 >> 0x4f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (local_220 >> 0x57 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (local_220 >> 0x5f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (local_220 >> 0x67 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (local_220 >> 0x6f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (local_220 >> 0x77 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(local_220 >> 0x7f,0) == '\0') &&
                                (local_220 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                ) && (local_220 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                              (local_220 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (local_220 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                             ) && (local_220 >> 0xa7 & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                           (local_220 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_220 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_220 >> 0xbf,0) == '\0') &&
                        (local_220 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (local_220 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_220 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (local_220 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_220 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (local_220 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_220 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  -1 < local_220[0x1f]) goto LAB_00d82acf;
              local_360 = local_1740;
              lStack_358 = lStack_1738;
              lStack_350 = lStack_1730;
              lStack_348 = lStack_1728;
              local_380 = local_1820;
              lStack_378 = lStack_1818;
              lStack_370 = lStack_1810;
              lStack_368 = lStack_1808;
              auVar68 = vpcmpgtq_avx2(auVar68,_local_1800);
              local_b00 = local_1840._0_8_;
              uStack_af8 = local_1840._8_8_;
              uStack_af0 = local_1840._16_8_;
              uStack_ae8 = local_1840._24_8_;
              local_b20 = local_18e0[0];
              lStack_b18 = local_18e0[1];
              lStack_b10 = local_18e0[2];
              lStack_b08 = local_18e0[3];
              local_1a40 = auVar68._0_8_;
              local_b40 = local_1a40;
              uStack_1a38 = auVar68._8_8_;
              uStack_b38 = uStack_1a38;
              uStack_1a30 = auVar68._16_8_;
              uStack_b30 = uStack_1a30;
              uStack_1a28 = auVar68._24_8_;
              uStack_b28 = uStack_1a28;
              local_1840 = vpblendvb_avx2(local_1840,auVar6,auVar68);
              local_b60 = local_1860._0_8_;
              uStack_b58 = local_1860._8_8_;
              uStack_b50 = local_1860._16_8_;
              uStack_b48 = local_1860._24_8_;
              local_b80 = local_1900[0];
              lStack_b78 = local_1900[1];
              lStack_b70 = local_1900[2];
              lStack_b68 = local_1900[3];
              local_ba0 = local_1a40;
              uStack_b98 = uStack_1a38;
              uStack_b90 = uStack_1a30;
              uStack_b88 = uStack_1a28;
              local_1860 = vpblendvb_avx2(local_1860,auVar1,auVar68);
              local_fa0 = local_1880._0_8_;
              uStack_f98 = local_1880._8_8_;
              uStack_f90 = local_1880._16_8_;
              uStack_f88 = local_1880._24_8_;
              local_fc0 = local_1600;
              uStack_fb8 = uStack_15f8;
              uStack_fb0 = uStack_15f0;
              uStack_fa8 = uStack_15e8;
              auVar18._8_8_ = uStack_15f8;
              auVar18._0_8_ = local_1600;
              auVar18._16_8_ = uStack_15f0;
              auVar18._24_8_ = uStack_15e8;
              local_bc0 = vpaddq_avx2(local_1880,auVar18);
              local_fe0 = local_1920[0];
              lStack_fd8 = local_1920[1];
              lStack_fd0 = local_1920[2];
              lStack_fc8 = local_1920[3];
              local_1000 = local_1600;
              uStack_ff8 = uStack_15f8;
              uStack_ff0 = uStack_15f0;
              uStack_fe8 = uStack_15e8;
              auVar17._8_8_ = uStack_15f8;
              auVar17._0_8_ = local_1600;
              auVar17._16_8_ = uStack_15f0;
              auVar17._24_8_ = uStack_15e8;
              local_be0 = vpaddq_avx2(auVar5,auVar17);
              local_c00 = local_1a40;
              uStack_bf8 = uStack_1a38;
              uStack_bf0 = uStack_1a30;
              uStack_be8 = uStack_1a28;
              local_1880 = vpblendvb_avx2(local_bc0,local_be0,auVar68);
              local_10b0 = local_1508 + local_14b0;
              _local_19c0 = *local_10b0;
            }
          }
LAB_00d82acf:
          local_14b4 = local_14b4 + 1;
        }
        local_10b8 = local_1500 + local_14dc;
        local_1a60 = *local_10b8;
        local_10c0 = local_1510 + local_14dc;
        lVar61 = (*local_10c0)[0];
        lVar77 = (*local_10c0)[1];
        lVar78 = (*local_10c0)[2];
        lStack_1a68 = (*local_10c0)[3];
        local_10c8 = local_1520 + local_14dc;
        lVar74 = (*local_10c8)[0];
        lVar75 = (*local_10c8)[1];
        lVar76 = (*local_10c8)[2];
        local_1618 = (*local_10c8)[3];
        local_10d0 = local_1530 + local_14dc;
        lVar73 = (*local_10d0)[0];
        lStack_1ab8 = (*local_10d0)[1];
        lVar48 = (*local_10d0)[2];
        local_1620 = (*local_10d0)[3];
        for (local_14b8 = 0; local_14b8 < local_14e0; local_14b8 = local_14b8 + 1) {
          auVar49 = ZEXT816(0) << 0x40;
          auVar5 = vpermq_avx2((undefined1  [32])local_1a60,0x90);
          local_1a60 = (__m256i)vpblendd_avx2(auVar5,ZEXT1632(auVar49),3);
          auVar16._8_8_ = lVar77;
          auVar16._0_8_ = lVar61;
          auVar16._16_8_ = lVar78;
          auVar16._24_8_ = lStack_1a68;
          auVar5 = vpermq_avx2(auVar16,0x90);
          auVar5 = vpblendd_avx2(auVar5,ZEXT1632(auVar49),3);
          lVar61 = auVar5._0_8_;
          lVar77 = auVar5._8_8_;
          lVar78 = auVar5._16_8_;
          lStack_1a68 = auVar5._24_8_;
          auVar15._8_8_ = lVar75;
          auVar15._0_8_ = lVar74;
          auVar15._16_8_ = lVar76;
          auVar15._24_8_ = local_1618;
          auVar5 = vpermq_avx2(auVar15,0x90);
          auVar5 = vpblendd_avx2(auVar5,ZEXT1632(auVar49),3);
          lVar74 = auVar5._0_8_;
          lVar75 = auVar5._8_8_;
          lVar76 = auVar5._16_8_;
          local_1618 = auVar5._24_8_;
          auVar13._8_8_ = lStack_1ab8;
          auVar13._0_8_ = lVar73;
          auVar13._16_8_ = lVar48;
          auVar13._24_8_ = local_1620;
          auVar5 = vpermq_avx2(auVar13,0x90);
          auVar5 = vpblendd_avx2(auVar5,ZEXT1632(auVar49),3);
          lVar73 = auVar5._0_8_;
          lStack_1ab8 = auVar5._8_8_;
          lVar48 = auVar5._16_8_;
          local_1620 = auVar5._24_8_;
        }
        local_1608 = local_1a60[3];
        local_1610 = lStack_1a68;
        local_3a0 = local_1640;
        uStack_398 = uStack_1638;
        uStack_390 = uStack_1630;
        uStack_388 = uStack_1628;
        auVar33._8_8_ = uStack_1638;
        auVar33._0_8_ = local_1640;
        auVar33._16_8_ = uStack_1630;
        auVar33._24_8_ = uStack_1628;
        auVar32._16_8_ = auStack_1670._0_8_;
        auVar32._0_16_ = local_1680;
        auVar32._24_8_ = auStack_1670._8_8_;
        local_1e0 = vpcmpgtq_avx2(auVar33,auVar32);
        local_3e0 = local_16a0;
        uStack_3d8 = uStack_1698;
        uStack_3d0 = uStack_1690;
        uStack_3c8 = uStack_1688;
        auVar31._8_8_ = uStack_1698;
        auVar31._0_8_ = local_16a0;
        auVar31._16_8_ = uStack_1690;
        auVar31._24_8_ = uStack_1688;
        auVar30._16_8_ = auStack_1650._0_8_;
        auVar30._0_16_ = local_1660;
        auVar30._24_8_ = auStack_1650._8_8_;
        local_200 = vpcmpgtq_avx2(auVar31,auVar30);
        local_240 = vpor_avx2(local_1e0,local_200);
        if ((((((((((((((((((((((((((((((((local_240 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_240 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_240 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_240 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_240 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_240 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_240 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_240 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_240 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_240 >> 0x4f & (undefined1  [32])0x1) !=
                                 (undefined1  [32])0x0) ||
                                (local_240 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (local_240 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (local_240 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || (local_240 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                             ) || (local_240 >> 0x77 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(local_240 >> 0x7f,0) != '\0') ||
                          (local_240 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_240 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_240 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_240 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_240 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_240 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_240 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_240 >> 0xbf,0) != '\0') ||
                  (local_240 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_240 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_240 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_240 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_240 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_240 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_240 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_240[0x1f] < '\0') {
          local_16a8->flag = local_16a8->flag | 0x40;
          local_1608 = 0;
          local_1610 = 0;
          local_1618 = 0;
          local_1620 = 0;
          local_14c0 = 0;
          local_14c4 = 0;
        }
        local_16a8->score = (int)local_1608;
        local_16a8->end_query = local_14c0;
        local_16a8->end_ref = local_14c4;
        ((local_16a8->field_4).stats)->matches = (int)local_1610;
        ((local_16a8->field_4).stats)->similar = (int)local_1618;
        ((local_16a8->field_4).stats)->length = (int)local_1620;
        local_400 = local_1660;
        auStack_3f0 = auStack_1650;
        local_3c0 = local_1680;
        auStack_3b0 = auStack_1670;
        parasail_free(local_1560);
        parasail_free(local_1558);
        parasail_free(local_1550);
        parasail_free(local_1548);
        parasail_free(local_1540);
        parasail_free(local_1538);
        parasail_free(local_1530);
        parasail_free(local_1528);
        parasail_free(local_1520);
        parasail_free(local_1518);
        parasail_free(local_1510);
        parasail_free(local_1508);
        parasail_free(local_1500);
        local_1490 = local_16a8;
      }
    }
  }
  return local_1490;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMStore = NULL;
    __m256i* restrict pvHMLoad = NULL;
    __m256i* restrict pvHSStore = NULL;
    __m256i* restrict pvHSLoad = NULL;
    __m256i* restrict pvHLStore = NULL;
    __m256i* restrict pvHLLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    int64_t* restrict boundary = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m256i*)profile->profile64.score;
    vProfileM = (__m256i*)profile->profile64.matches;
    vProfileS = (__m256i*)profile->profile64.similar;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m256i(32, segLen);
    pvHLoad   = parasail_memalign___m256i(32, segLen);
    pvHMStore = parasail_memalign___m256i(32, segLen);
    pvHMLoad  = parasail_memalign___m256i(32, segLen);
    pvHSStore = parasail_memalign___m256i(32, segLen);
    pvHSLoad  = parasail_memalign___m256i(32, segLen);
    pvHLStore = parasail_memalign___m256i(32, segLen);
    pvHLLoad  = parasail_memalign___m256i(32, segLen);
    pvE       = parasail_memalign___m256i(32, segLen);
    pvEM      = parasail_memalign___m256i(32, segLen);
    pvES      = parasail_memalign___m256i(32, segLen);
    pvEL      = parasail_memalign___m256i(32, segLen);
    boundary  = parasail_memalign_int64_t(32, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m256i(pvHMStore, vZero, segLen);
    parasail_memset___m256i(pvHSStore, vZero, segLen);
    parasail_memset___m256i(pvHLStore, vZero, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvHStore[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vH_dag;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        const __m256i* vP = NULL;
        const __m256i* vPM = NULL;
        const __m256i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop.  */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vHM = _mm256_load_si256(&pvHMStore[segLen - 1]);
        vHS = _mm256_load_si256(&pvHSStore[segLen - 1]);
        vHL = _mm256_load_si256(&pvHLStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 8);
        vHM = _mm256_slli_si256_rpl(vHM, 8);
        vHS = _mm256_slli_si256_rpl(vHS, 8);
        vHL = _mm256_slli_si256_rpl(vHL, 8);

        /* insert upper boundary condition */
        vH = _mm256_insert_epi64_rpl(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m256i case1;
            __m256i case2;

            vE = _mm256_load_si256(pvE+ i);
            vEM = _mm256_load_si256(pvEM+ i);
            vES = _mm256_load_si256(pvES+ i);
            vEL = _mm256_load_si256(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_add_epi64(vH, _mm256_load_si256(vP + i));
            vH = _mm256_max_epi64_rpl(vH_dag, vE);
            vH = _mm256_max_epi64_rpl(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);

            case1 = _mm256_cmpeq_epi64(vH, vH_dag);
            case2 = _mm256_cmpeq_epi64(vH, vF);

            /* calculate vM */
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi64(vHM, _mm256_load_si256(vPM + i)),
                    case1);
            _mm256_store_si256(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi64(vHS, _mm256_load_si256(vPS + i)),
                    case1);
            _mm256_store_si256(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi64(vHL, vOne),
                    case1);
            _mm256_store_si256(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm256_sub_epi64(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_sub_epi64(vE, vGapE);
            vE = _mm256_max_epi64_rpl(vEF_opn, vE_ext);
            case1 = _mm256_cmpgt_epi64(vEF_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vEL, vOne),
                    _mm256_add_epi64(vHL, vOne),
                    case1);
            _mm256_store_si256(pvE + i, vE);
            _mm256_store_si256(pvEM + i, vEM);
            _mm256_store_si256(pvES + i, vES);
            _mm256_store_si256(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm256_sub_epi64(vF, vGapE);
            vF = _mm256_max_epi64_rpl(vEF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vEF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi64(vFL, vOne),
                    _mm256_add_epi64(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
            vHM = _mm256_load_si256(pvHMLoad + i);
            vHS = _mm256_load_si256(pvHSLoad + i);
            vHL = _mm256_load_si256(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            int64_t tmp = boundary[j+1]-open;
            int64_t tmp2 = tmp < INT64_MIN ? INT64_MIN : tmp;
            vHp = _mm256_slli_si256_rpl(vHp, 8);
            vF = _mm256_slli_si256_rpl(vF, 8);
            vFM = _mm256_slli_si256_rpl(vFM, 8);
            vFS = _mm256_slli_si256_rpl(vFS, 8);
            vFL = _mm256_slli_si256_rpl(vFL, 8);
            vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
            vF = _mm256_insert_epi64_rpl(vF, tmp2, 0);
            vFL = _mm256_insert_epi64_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m256i case1;
                __m256i case2;
                __m256i cond;

                vHp = _mm256_add_epi64(vHp, _mm256_load_si256(vP + i));
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi64_rpl(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                case1 = _mm256_cmpeq_epi64(vH, vHp);
                case2 = _mm256_cmpeq_epi64(vH, vF);
                cond = _mm256_andnot_si256(case1, case2);

                /* calculate vM */
                vHM = _mm256_load_si256(pvHMStore + i);
                vHM = _mm256_blendv_epi8(vHM, vFM, cond);
                _mm256_store_si256(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm256_load_si256(pvHSStore + i);
                vHS = _mm256_blendv_epi8(vHS, vFS, cond);
                _mm256_store_si256(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm256_load_si256(pvHLStore + i);
                vHL = _mm256_blendv_epi8(vHL, vFL, cond);
                _mm256_store_si256(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm256_sub_epi64(vH, vGapO);
                vF_ext = _mm256_sub_epi64(vF, vGapE);
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi64(vF_ext, vEF_opn),
                                _mm256_cmpeq_epi64(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm256_max_epi64_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm256_cmpgt_epi64(vEF_opn, vF_ext);
                vFM = _mm256_blendv_epi8(vFM, vHM, cond);
                vFS = _mm256_blendv_epi8(vFS, vHS, cond);
                vFL = _mm256_blendv_epi8(
                        _mm256_add_epi64(vFL, vOne),
                        _mm256_add_epi64(vHL, vOne),
                        cond);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            vHM = _mm256_load_si256(pvHMStore + offset);
            vHS = _mm256_load_si256(pvHSStore + offset);
            vHL = _mm256_load_si256(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl (vH, 8);
                vHM = _mm256_slli_si256_rpl (vHM, 8);
                vHS = _mm256_slli_si256_rpl (vHS, 8);
                vHL = _mm256_slli_si256_rpl (vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
            result->stats->rowcols->length_row[j] = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        __m256i vHM = _mm256_load_si256(pvHMStore+i);
        __m256i vHS = _mm256_load_si256(pvHSStore+i);
        __m256i vHL = _mm256_load_si256(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvHStore + offset);
        __m256i vHM = _mm256_load_si256(pvHMStore + offset);
        __m256i vHS = _mm256_load_si256(pvHSStore + offset);
        __m256i vHL = _mm256_load_si256(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl (vH, 8);
            vHM = _mm256_slli_si256_rpl (vHM, 8);
            vHS = _mm256_slli_si256_rpl (vHS, 8);
            vHL = _mm256_slli_si256_rpl (vHL, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
        matches = (int64_t) _mm256_extract_epi64_rpl (vHM, 3);
        similar = (int64_t) _mm256_extract_epi64_rpl (vHS, 3);
        length = (int64_t) _mm256_extract_epi64_rpl (vHL, 3);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}